

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_hash.c
# Opt level: O0

_Bool gravity_hash_insert(gravity_hash_t *hashtable,gravity_value_t key,gravity_value_t value)

{
  gravity_value_t gVar1;
  gravity_value_t gVar2;
  gravity_value_t gVar3;
  _Bool _Var4;
  uint32_t uVar5;
  int iVar6;
  hash_node_t *phVar7;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar8;
  hash_node_t *local_48;
  hash_node_t *node;
  uint32_t position;
  uint32_t hash;
  gravity_hash_t *hashtable_local;
  gravity_value_t value_local;
  gravity_value_t key_local;
  
  aVar8.n = (gravity_int_t)value.isa;
  if (hashtable->count < 0x40000000) {
    gVar1.field_1.n._0_4_ = (uint)node;
    gVar1.isa = (gravity_class_t *)local_48;
    gVar1.field_1.n._4_4_ = node._4_4_;
    uVar5 = (*hashtable->compute_fn)(gVar1);
    node._0_4_ = uVar5 % hashtable->size;
    local_48 = hashtable->nodes[(uint)node];
    if (local_48 != (hash_node_t *)0x0) {
      hashtable->ncollision = hashtable->ncollision + 1;
    }
    for (; local_48 != (hash_node_t *)0x0; local_48 = local_48->next) {
      if ((local_48->hash == uVar5) &&
         (gVar2.field_1.n._0_4_ = (uint)node, gVar2.isa = (gravity_class_t *)local_48,
         gVar2.field_1.n._4_4_ = uVar5, gVar3.field_1.n = aVar8.n,
         gVar3.isa = (gravity_class_t *)hashtable, _Var4 = (*hashtable->isequal_fn)(gVar2,gVar3),
         _Var4)) {
        (local_48->value).isa = (gravity_class_t *)aVar8;
        (local_48->value).field_1.n = (gravity_int_t)value.field_1;
        return false;
      }
    }
    if ((double)hashtable->size * 0.75 <= (double)hashtable->count) {
      iVar6 = gravity_hash_resize(hashtable);
      if (iVar6 == -1) {
        return false;
      }
      node._0_4_ = uVar5 % hashtable->size;
    }
    phVar7 = (hash_node_t *)gravity_calloc((gravity_vm *)0x0,1,0x30);
    if (phVar7 == (hash_node_t *)0x0) {
      key_local.field_1.n._7_1_ = 0;
    }
    else {
      (phVar7->key).isa = key.isa;
      (phVar7->key).field_1.n = (gravity_int_t)key.field_1;
      phVar7->hash = uVar5;
      (phVar7->value).isa = (gravity_class_t *)aVar8;
      (phVar7->value).field_1.n = (gravity_int_t)value.field_1;
      phVar7->next = hashtable->nodes[(uint)node];
      hashtable->nodes[(uint)node] = phVar7;
      hashtable->count = hashtable->count + 1;
      key_local.field_1.n._7_1_ = 1;
    }
  }
  else {
    key_local.field_1.n._7_1_ = 0;
  }
  return (_Bool)key_local.field_1.n._7_1_;
}

Assistant:

bool gravity_hash_insert (gravity_hash_t *hashtable, gravity_value_t key, gravity_value_t value) {
    if (hashtable->count >= GRAVITYHASH_MAXENTRIES) return false;
    
    register uint32_t hash = hashtable->compute_fn(key);
    register uint32_t position = hash % hashtable->size;

    hash_node_t *node = hashtable->nodes[position];
    if (node) INC_COLLISION(hashtable);

    // check if the key is already in the table
    while (node) {
        if ((node->hash == hash) && (hashtable->isequal_fn(key, node->key))) {
            node->value = value;
            return false;
        }
        node = node->next;
    }

    // resize table if the threshold is exceeded
    // default threshold is: <table size> * <load factor GRAVITYHASH_THRESHOLD>
    if (hashtable->count >= hashtable->size * GRAVITYHASH_THRESHOLD) {
        if (gravity_hash_resize(hashtable) == -1) return false;
        // recompute position here because hashtable->size has changed!
        position = hash % hashtable->size;
    }

    // allocate new entry and set new data
    if (!(node = mem_alloc(NULL, sizeof(hash_node_t)))) return false;
    node->key = key;
    node->hash = hash;
    node->value = value;
    node->next = hashtable->nodes[position];
    hashtable->nodes[position] = node;
    ++hashtable->count;

    return true;
}